

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O3

list<CfgNode_*,_std::allocator<CfgNode_*>_> * __thiscall
CFG::nodes_abi_cxx11_(list<CfgNode_*,_std::allocator<CfgNode_*>_> *__return_storage_ptr__,CFG *this)

{
  size_t *psVar1;
  _Base_ptr p_Var2;
  _List_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  (__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>)._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>)._M_impl._M_node.
  _M_size = 0;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)this->m_entryNode;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>).
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (this->m_exitNode != (CfgNode *)0x0) {
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this->m_exitNode;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (this->m_haltNode != (CfgNode *)0x0) {
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)this->m_haltNode;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  for (p_Var4 = (this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_nodesMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var2 = p_Var4[1]._M_parent;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(__return_storage_ptr__->super__List_base<CfgNode_*,_std::allocator<CfgNode_*>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<CfgNode*> CFG::nodes() const {
	std::list<CfgNode*> nodes;

	nodes.push_back(m_entryNode);

	if (m_exitNode)
		nodes.push_back(m_exitNode);

	if (m_haltNode)
		nodes.push_back(m_haltNode);

	std::transform(m_nodesMap.begin(), m_nodesMap.end(),
	    std::back_inserter(nodes),
	    [](const std::map<Addr, CfgNode*>::value_type &pair) {
			return pair.second;
		}
	);

	return nodes;
}